

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

void __thiscall
libtorrent::dht_pkt_alert::dht_pkt_alert
          (dht_pkt_alert *this,stack_allocator *alloc,span<const_char> buf,direction_t d,
          endpoint *ep)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  allocation_slot aVar4;
  rep rVar5;
  
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__alert_00455710;
  rVar5 = std::chrono::_V2::system_clock::now();
  (this->super_alert).m_timestamp.__d.__r = rVar5;
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__alert_00457070;
  this->direction = d;
  uVar1 = *(undefined8 *)((long)&(ep->impl_).data_ + 8);
  uVar2 = *(undefined8 *)((long)&(ep->impl_).data_ + 0xc);
  uVar3 = *(undefined8 *)((long)&(ep->impl_).data_ + 0x14);
  *(undefined8 *)&(this->node).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_ =
       *(undefined8 *)&(ep->impl_).data_;
  *(undefined8 *)((long)&(this->node).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_ + 8) =
       uVar1;
  *(undefined8 *)((long)&(this->node).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_ + 0xc)
       = uVar2;
  *(undefined8 *)((long)&(this->node).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_ + 0x14)
       = uVar3;
  (this->m_alloc)._M_data = alloc;
  aVar4 = aux::stack_allocator::copy_buffer(alloc,buf);
  (this->m_msg_idx).m_idx = aVar4.m_idx;
  this->m_size = (int)buf.m_len;
  this->dir = d;
  return;
}

Assistant:

dht_pkt_alert::dht_pkt_alert(aux::stack_allocator& alloc
		, span<char const> buf, dht_pkt_alert::direction_t d
		, udp::endpoint const& ep)
		: direction(d)
		, node(ep)
		, m_alloc(alloc)
		, m_msg_idx(alloc.copy_buffer(buf))
		, m_size(aux::numeric_cast<int>(buf.size()))
#if TORRENT_ABI_VERSION == 1
		, dir(d)
#endif
	{}